

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
          (String *__return_storage_ptr__,detail *this,
          set<int,_std::less<int>,_std::allocator<int>_> *lhs,char *op,
          set<int,_std::less<int>,_std::allocator<int>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_28;
  set<int,_std::less<int>,_std::allocator<int>_> *rhs_local;
  char *op_local;
  set<int,_std::less<int>,_std::allocator<int>_> *lhs_local;
  
  local_28 = (set<int,_std::less<int>,_std::allocator<int>_> *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (set<int,_std::less<int>,_std::allocator<int>_> *)__return_storage_ptr__;
  toString<std::set<int,_std::less<int>,_std::allocator<int>_>,_true>
            (&local_58,(set<int,_std::less<int>,_std::allocator<int>_> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::set<int,_std::less<int>,_std::allocator<int>_>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }